

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateString(Tables *this,string *value)

{
  string *this_00;
  string *in_RSI;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,in_RSI);
  std::
  vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
  ::emplace_back<std::__cxx11::string*&>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return this_00;
}

Assistant:

std::string* DescriptorPool::Tables::AllocateString(const std::string& value) {
  std::string* result = new std::string(value);
  strings_.emplace_back(result);
  return result;
}